

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCacheStore(Parse *pParse,int iTab,int iCol,int iReg)

{
  uint uVar1;
  yColCache *pyVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  
  if ((pParse->db->dbOptFlags & 2) == 0) {
    iVar3 = 10;
    pyVar2 = pParse->aColCache;
    do {
      if (pyVar2->iReg == 0) goto LAB_0016c17a;
      pyVar2 = pyVar2 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    piVar4 = &pParse->aColCache[0].lru;
    uVar5 = 0;
    iVar3 = 0x7fffffff;
    uVar1 = 0xffffffff;
    do {
      if (*piVar4 < iVar3) {
        uVar1 = uVar5;
        iVar3 = *piVar4;
      }
      uVar5 = uVar5 + 1;
      piVar4 = piVar4 + 6;
    } while (uVar5 != 10);
    if (-1 < (int)uVar1) {
      pyVar2 = pParse->aColCache + uVar1;
LAB_0016c17a:
      pyVar2->iLevel = pParse->iCacheLevel;
      pyVar2->iTable = iTab;
      pyVar2->iColumn = iCol;
      pyVar2->iReg = iReg;
      pyVar2->tempReg = '\0';
      iVar3 = pParse->iCacheCnt;
      pParse->iCacheCnt = iVar3 + 1;
      pyVar2->lru = iVar3;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheStore(Parse *pParse, int iTab, int iCol, int iReg){
  int i;
  int minLru;
  int idxLru;
  struct yColCache *p;

  assert( iReg>0 );  /* Register numbers are always positive */
  assert( iCol>=-1 && iCol<32768 );  /* Finite column numbers */

  /* The SQLITE_ColumnCache flag disables the column cache.  This is used
  ** for testing only - to verify that SQLite always gets the same answer
  ** with and without the column cache.
  */
  if( OptimizationDisabled(pParse->db, SQLITE_ColumnCache) ) return;

  /* First replace any existing entry.
  **
  ** Actually, the way the column cache is currently used, we are guaranteed
  ** that the object will never already be in cache.  Verify this guarantee.
  */
#ifndef NDEBUG
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    assert( p->iReg==0 || p->iTable!=iTab || p->iColumn!=iCol );
  }
#endif

  /* Find an empty slot and replace it */
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg==0 ){
      p->iLevel = pParse->iCacheLevel;
      p->iTable = iTab;
      p->iColumn = iCol;
      p->iReg = iReg;
      p->tempReg = 0;
      p->lru = pParse->iCacheCnt++;
      return;
    }
  }

  /* Replace the last recently used */
  minLru = 0x7fffffff;
  idxLru = -1;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->lru<minLru ){
      idxLru = i;
      minLru = p->lru;
    }
  }
  if( ALWAYS(idxLru>=0) ){
    p = &pParse->aColCache[idxLru];
    p->iLevel = pParse->iCacheLevel;
    p->iTable = iTab;
    p->iColumn = iCol;
    p->iReg = iReg;
    p->tempReg = 0;
    p->lru = pParse->iCacheCnt++;
    return;
  }
}